

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_eq.h
# Opt level: O0

void __thiscall
mp::
CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
::ConvertCtxNeg(CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
                *this,ItemType *eq0c,int param_3)

{
  double dVar1;
  initializer_list<double> __l;
  bool bVar2;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_> *this_00;
  reference pvVar3;
  FunctionalConstraint *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar4;
  vector<int,_std::allocator<int>_> newvars;
  double cmpEps;
  PreprocessInfoStd bNt;
  bool valid;
  int res;
  ConType *con;
  undefined8 in_stack_ffffffffffffea78;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffea80;
  QuadAndLinTerms *in_stack_ffffffffffffea88;
  MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffea90;
  undefined4 in_stack_ffffffffffffea9c;
  undefined1 uVar5;
  QuadAndLinTerms *in_stack_ffffffffffffeaa0;
  QuadAndLinTerms *le;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_ffffffffffffeaa8;
  AlgConRhs<_1> in_stack_ffffffffffffeab0;
  QuadAndLinTerms *in_stack_ffffffffffffeab8;
  undefined4 in_stack_ffffffffffffeac0;
  undefined4 in_stack_ffffffffffffeac4;
  undefined8 in_stack_ffffffffffffead8;
  Type type;
  double in_stack_ffffffffffffeae0;
  vector<int,_std::allocator<int>_> *v;
  vector<double,_std::allocator<double>_> *c;
  LinTerms *in_stack_ffffffffffffeaf0;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffeaf8;
  double in_stack_ffffffffffffeb28;
  double dVar6;
  double in_stack_ffffffffffffeb30;
  undefined8 in_stack_ffffffffffffeb38;
  int var_00;
  AlgConRhs<1> local_14a8 [181];
  NodeRange local_f00;
  AlgConRhs<_1> local_ef0 [116];
  QuadAndLinTerms local_b50;
  NodeRange local_948;
  AlgConRhs<1> local_938;
  undefined1 local_929 [25];
  undefined1 *local_910;
  undefined8 local_908;
  vector<double,_std::allocator<double>_> local_7d0;
  NodeRange local_7b8;
  AlgConRhs<_1> local_7a8 [116];
  NodeRange local_408;
  AlgConRhs<1> local_3e8 [116];
  double local_48;
  PreprocessInfo<int> local_40;
  undefined1 local_25;
  int local_24;
  ConType *local_20;
  FunctionalConstraint *local_10;
  
  uVar5 = (undefined1)((uint)in_stack_ffffffffffffea9c >> 0x18);
  type = (Type)((ulong)in_stack_ffffffffffffead8 >> 0x20);
  var = (int)((ulong)in_stack_ffffffffffffea78 >> 0x20);
  var_00 = (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20);
  local_10 = in_RSI;
  local_20 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
             ::GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                              *)0x26641b);
  local_24 = FunctionalConstraint::GetResultVar(local_10);
  bVar2 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::empty
                    ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)0x266444);
  if (bVar2) {
    dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
    local_25 = dVar6 == 0.0;
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(in_RDI,var_00,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
    return;
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  bVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_ffffffffffffea80,var);
  if (bVar2) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    dVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_ffffffffffffea80,var);
    if (dVar6 != 0.0) {
      return;
    }
    if (NAN(dVar6)) {
      return;
    }
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType
            ((BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),
             in_stack_ffffffffffffeab8);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  PreprocessInfo<int>::get_result_type(&local_40);
  local_48 = MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ComparisonEps(in_stack_ffffffffffffea90,
                             (Type)((ulong)in_stack_ffffffffffffea88 >> 0x20));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  bVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_ffffffffffffea80,var);
  if (bVar2) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    dVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_ffffffffffffea80,var);
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      dVar6 = PreprocessInfo<int>::lb(&local_40);
      dVar1 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
      if (dVar1 - local_48 < dVar6) {
        BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)in_RDI);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
        QuadAndLinTerms::QuadAndLinTerms
                  ((QuadAndLinTerms *)in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
        dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
        AlgConRhs<1>::AlgConRhs(local_3e8,dVar6 + local_48);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                   in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
                   (AlgConRhs<1>)in_stack_ffffffffffffeab0.rhs_,(bool)uVar5);
        local_408 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_ffffffffffffeab0.rhs_,
                               (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                               in_stack_ffffffffffffeaa8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                   in_stack_ffffffffffffea80);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea80);
        return;
      }
      dVar6 = PreprocessInfo<int>::ub(&local_40);
      dVar1 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
      if (dVar6 < dVar1 + local_48) {
        BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)in_RDI);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
        QuadAndLinTerms::QuadAndLinTerms
                  ((QuadAndLinTerms *)in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
        dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
        AlgConRhs<-1>::AlgConRhs(local_7a8,dVar6 - local_48);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,in_stack_ffffffffffffeab0,
                   (bool)uVar5);
        local_7b8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_ffffffffffffeab0.rhs_,
                               (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                               in_stack_ffffffffffffeaa8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_ffffffffffffea80);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea80);
        return;
      }
    }
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  c = &local_7d0;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(in_stack_ffffffffffffeaf8,(size_t)in_stack_ffffffffffffeaf0,(double)c,
                      in_stack_ffffffffffffeae0,type);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea90,
             (value_type *)in_stack_ffffffffffffea88);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  local_929._17_8_ = 0x3ff0000000000000;
  local_929._1_8_ = 0x3ff0000000000000;
  local_929._9_8_ = 0x3ff0000000000000;
  local_910 = local_929 + 1;
  local_908 = 3;
  v = (vector<int,_std::allocator<int>_> *)local_929;
  std::allocator<double>::allocator((allocator<double> *)0x266964);
  __l._M_len._0_4_ = in_stack_ffffffffffffeac0;
  __l._M_array = (iterator)in_stack_ffffffffffffeab8;
  __l._M_len._4_4_ = in_stack_ffffffffffffeac4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeab0.rhs_,__l,
             (allocator_type *)in_stack_ffffffffffffeaa8);
  LinTerms::LinTerms(in_stack_ffffffffffffeaf0,c,v);
  AlgConRhs<1>::AlgConRhs(&local_938,1.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_ffffffffffffeaa8,
             &in_stack_ffffffffffffeaa0->super_LinTerms,(AlgConRhs<1>)in_stack_ffffffffffffeab0.rhs_
             ,(bool)uVar5);
  local_948 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_ffffffffffffeab0.rhs_,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                         in_stack_ffffffffffffeaa8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_ffffffffffffea80);
  LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffea80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea90);
  std::allocator<double>::~allocator((allocator<double> *)0x266a4f);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)&local_7d0,0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  QuadAndLinTerms::QuadAndLinTerms
            ((QuadAndLinTerms *)in_stack_ffffffffffffea90,in_stack_ffffffffffffea88);
  dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
  AlgConRhs<-1>::AlgConRhs(local_ef0,dVar6 - local_48);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
             in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,in_stack_ffffffffffffeab0,
             (bool)uVar5);
  le = &local_b50;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
  IndicatorConstraint((IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                       *)in_stack_ffffffffffffea90,(int)((ulong)in_stack_ffffffffffffea88 >> 0x20),
                      (int)in_stack_ffffffffffffea88,
                      (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                      in_stack_ffffffffffffea80);
  NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_ffffffffffffeab0.rhs_,in_stack_ffffffffffffeaa8);
  local_f00 = NVar4;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
  ~IndicatorConstraint
            ((IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
              *)in_stack_ffffffffffffea80);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
             in_stack_ffffffffffffea80);
  QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffea80);
  this_00 = (IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_> *
            )BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      *)in_RDI);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&local_7d0,1);
  uVar5 = (undefined1)((uint)*pvVar3 >> 0x18);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)this_00,in_stack_ffffffffffffea88);
  dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
  AlgConRhs<1>::AlgConRhs(local_14a8,dVar6 + local_48);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)NVar4.ir_,le,
             (AlgConRhs<1>)NVar4.pvn_,(bool)uVar5);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
  IndicatorConstraint(this_00,(int)((ulong)in_stack_ffffffffffffea88 >> 0x20),
                      (int)in_stack_ffffffffffffea88,
                      (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                      in_stack_ffffffffffffea80);
  NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)NVar4.pvn_,
                     (IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
                      *)NVar4.ir_);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
  ~IndicatorConstraint
            ((IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
              *)NVar4.ir_);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)NVar4.ir_);
  QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)NVar4.ir_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& eq0c, int ) {
    const auto& con = eq0c.GetConstraint();
    const auto res = eq0c.GetResultVar();
    if (con.empty()) {
      bool valid = !con.rhs();
      GetMC().NarrowVarBounds(res, valid, valid);
    } else if ( !GetMC().is_fixed(res) ||   // not fixed, or
                !GetMC().fixed_value(res) ) // fixed to 0
    {
      auto bNt = GetMC().ComputeBoundsAndType(con.GetBody());
      double cmpEps = GetMC().ComparisonEps( bNt.get_result_type() );
#define COND_LIN_EQ__USE_FLAT_ALGEBRA
#ifndef COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Not doing this.
      // Reason: the below OR propagates CTX+ into res,
      // which is the expression we are redefining,
      // but this is not necessary. See #248.
      // Happens on eqVarConst01.mod.
      /// res3 ==> (res || body <= rhs-eps || body >= rhs+eps)
      auto res3 = GetMC().AssignResultVar2Args(
          OrConstraint{ {
            res,
            GetMC().AssignResultVar2Args(   // <=
                ConditionalConstraint< AlgCon<-1> >
                { { con.GetBody(), con.rhs() - cmpEps } }),
            GetMC().AssignResultVar2Args(   // >=
                ConditionalConstraint< AlgCon<1> >
                { { con.GetBody(), con.rhs() + cmpEps } })
          } });
      GetMC().FixAsTrue(res3);
#else  // COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Old way: straight to algebra and indicators.
      // This could duplicate the below indicators,
      // but simpler as of now:
      // the indicators redefine conditional inequalities
      // which, in the above variant, could have been redefined
      // in CTX- before, see int_ne_05_redef_ctx.mod,
      // thus losing the CTX+ redefinition, see #248.
      if (GetMC().is_fixed(res)  // This prepro would be unnec with logicals
          && !GetMC().fixed_value(res)) {  // preprocess: fixed to 0
        if (bNt.lb() > con.rhs() - cmpEps) { // body > value-eps
          GetMC().AddConstraint(
              AlgCon<1>{ con.GetBody(), con.rhs() + cmpEps } );
          return;
        }
        if (bNt.ub() < con.rhs() + cmpEps) { // body < value+eps
          GetMC().AddConstraint(
              AlgCon<-1>{ con.GetBody(), con.rhs() - cmpEps } );
          return;
        }
      }
      auto newvars = GetMC().AddVars_returnIds(2, 0.0, 1.0, var::INTEGER);
      newvars.push_back( res );
      GetMC().AddConstraint( LinConGE(   // b1+b2+resvar >= 1
          {{1.0, 1.0, 1.0}, newvars},
          1.0 ) );
      {
        GetMC().AddConstraint(IndicatorConstraint< AlgCon<-1> >(
            newvars[0], 1,
            { con.GetBody(),
             con.rhs() - cmpEps }));
      }
      GetMC().AddConstraint(IndicatorConstraint< AlgCon<1> >(
          newvars[1], 1,
          { con.GetBody(),
           con.rhs() + cmpEps }));
#endif  // USE_FLAT_ALGEBRA
    } // else, skip
  }